

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEnd)

{
  XMLDocument *pXVar1;
  XMLNode *node_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  XMLNode *pXVar5;
  undefined4 extraout_var_01;
  char *q;
  XMLNode *node;
  StrPair endTag;
  XMLNode *local_58;
  StrPair local_50;
  StrPair *local_38;
  undefined4 extraout_var_00;
  
  local_38 = parentEnd;
  while( true ) {
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    if (*p == '\0') {
      return (char *)0x0;
    }
    local_58 = (XMLNode *)0x0;
    pcVar4 = XMLDocument::Identify(this->_document,p,&local_58);
    node_00 = local_58;
    if (local_58 == (XMLNode *)0x0) {
      return (char *)0x0;
    }
    local_50._flags = 0;
    local_50._start = (char *)0x0;
    local_50._end = (char *)0x0;
    iVar3 = (*local_58->_vptr_XMLNode[0x11])(local_58,pcVar4,&local_50);
    p = (char *)CONCAT44(extraout_var,iVar3);
    if (p == (char *)0x0) {
      DeleteNode(node_00);
      pXVar1 = this->_document;
      if (pXVar1->_errorID == XML_NO_ERROR) {
        pXVar1->_errorID = XML_ERROR_PARSING;
        pXVar1->_errorStr1 = (char *)0x0;
        pXVar1->_errorStr2 = (char *)0x0;
      }
      goto LAB_001b442f;
    }
    iVar3 = (*node_00->_vptr_XMLNode[4])(node_00);
    pXVar5 = (XMLNode *)CONCAT44(extraout_var_00,iVar3);
    if ((pXVar5 != (XMLNode *)0x0) &&
       (pXVar1 = this->_document, (pXVar1->super_XMLNode)._firstChild != (XMLNode *)0x0)) {
      pcVar4 = Value(pXVar5);
      pXVar1->_errorID = XML_ERROR_PARSING_DECLARATION;
      pXVar1->_errorStr1 = pcVar4;
      pXVar1->_errorStr2 = (char *)0x0;
      DeleteNode(pXVar5);
      goto LAB_001b442f;
    }
    iVar3 = (**node_00->_vptr_XMLNode)(node_00);
    pXVar5 = (XMLNode *)CONCAT44(extraout_var_01,iVar3);
    if (pXVar5 != (XMLNode *)0x0) break;
LAB_001b43ae:
    InsertEndChild(this,node_00);
    StrPair::Reset(&local_50);
  }
  iVar3 = *(int *)&pXVar5[1]._vptr_XMLNode;
  if (iVar3 == 2) {
    if (local_38 != (StrPair *)0x0) {
      StrPair::TransferTo(&pXVar5->_value,local_38);
    }
    (*node_00->_memPool->_vptr_MemPool[5])();
    DeleteNode(node_00);
    StrPair::Reset(&local_50);
    return p;
  }
  if (local_50._start == local_50._end) {
    if (iVar3 != 0) goto LAB_001b43ae;
  }
  else if (iVar3 == 0) {
    pcVar4 = StrPair::GetStr(&local_50);
    q = Value(pXVar5);
    bVar2 = XMLUtil::StringEqual(pcVar4,q,0x7fffffff);
    if (bVar2) goto LAB_001b43ae;
  }
  pXVar1 = this->_document;
  pcVar4 = Value(pXVar5);
  pXVar1->_errorID = XML_ERROR_MISMATCHED_ELEMENT;
  pXVar1->_errorStr1 = pcVar4;
  pXVar1->_errorStr2 = (char *)0x0;
  DeleteNode(node_00);
LAB_001b442f:
  StrPair::Reset(&local_50);
  return (char *)0x0;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEnd )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        if ( node == 0 ) {
            break;
        }

        StrPair endTag;
        p = node->ParseDeep( p, &endTag );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, 0, 0 );
            }
            break;
        }

        XMLDeclaration* decl = node->ToDeclaration();
        if ( decl ) {
                // A declaration can only be the first child of a document.
                // Set error, if document already has children.
                if ( !_document->NoChildren() ) {
                        _document->SetError( XML_ERROR_PARSING_DECLARATION, decl->Value(), 0);
                        DeleteNode( decl );
                        break;
                }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEnd ) {
                    ele->_value.TransferTo( parentEnd );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, ele->Name(), 0 );
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}